

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

value value_type_create(void *data,size_t bytes,type_id id)

{
  undefined4 in_EDX;
  void *in_RSI;
  value in_RDI;
  value v;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  local_8 = value_alloc(in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    value_from(in_RDI,in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    value_from(in_RDI,in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  }
  return local_8;
}

Assistant:

value value_type_create(const void *data, size_t bytes, type_id id)
{
	value v = value_alloc(bytes + sizeof(type_id));

	if (v == NULL)
	{
		return NULL;
	}

	/* Memset body */
	value_from(v, data, bytes);

	/* Memset header */
	value_from((value)(((uintptr_t)v) + bytes), &id, sizeof(type_id));

	return v;
}